

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O0

void test_cipher_substitution_with_data(void)

{
  FILE *pFVar1;
  cipher_data data2;
  char result2 [261];
  cipher_data data;
  char key [27];
  char result [261];
  char text [261];
  text_scorer scorer;
  
  pFVar1 = fopen("./english_quadgrams.txt","r");
  scorer_load_data(&stack0xffffffffffe41bb8,pFVar1);
  memcpy(&stack0xffffffffffe41aa8,
         "SOWFBRKAWFCZFSBSCSBQITBKOWLBFXTBKOWLSOXSOXFZWWIBICFWUQLRXINOCIJLWJFQUNWXLFBSZXFBTXAANTQIFBFSFQUFCZFSBSCSBIMWHWLNKAXBISWGSTOXLXTSWLUQLXJBUUWLWISTBKOWLSWGSTOXLXTSWLBSJBUUWLFULQRTXWFXLTBKOWLBISOXSSOWTBKOWLXAKOXZWSBFIQSFBRKANSOWXAKOXZWSFOBUSWJBSBFTQRKAWSWANECRZAWJ"
         ,0x105);
  data.ct = &data.success;
  data.key._0_1_ = 1;
  data._16_8_ = &stack0xffffffffffe41bb8;
  data.scorer = (text_scorer *)(key + 0x18);
  data.result._0_1_ = 0;
  substitution_with_data(&stack0xffffffffffe41948);
  UnityAssertEqualNumber(1,(ulong)((byte)data.result & 1),(char *)0x0,0xd8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("LIUZJSXVNDPRGYHQOMTCFKEAWB",data.ct,(char *)0x0,0xd9);
  UnityAssertEqualString
            ("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASICALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTERITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITISCOMPLETELYJUMBLED"
             ,(char *)data.scorer,(char *)0x0,0xdd);
  data2.ct = "LIUZJSXVNDPRGYHQOMTCFKEAWB";
  data2.key._0_1_ = 0;
  data2._16_8_ = &stack0xffffffffffe41bb8;
  data2.scorer = (text_scorer *)&data2.success;
  data2.result._0_1_ = 0;
  substitution_with_data(&stack0xffffffffffe41808);
  UnityAssertEqualNumber(1,(ulong)((byte)data2.result & 1),(char *)0x0,0xed,UNITY_DISPLAY_STYLE_INT)
  ;
  UnityAssertEqualString
            ("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASICALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTERITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITISCOMPLETELYJUMBLED"
             ,(char *)data2.scorer,(char *)0x0,0xf1);
  return;
}

Assistant:

void test_cipher_substitution_with_data(void)
{
	// Load the quadgram data
	struct text_scorer scorer;
	scorer_load_data(&scorer, fopen("./english_quadgrams.txt", "r"));

	// Test autocrack

	char text[] = "SOWFBRKAWFCZFSBSCSBQITBKOWLBFXTBKOWLSOXSOXFZWWIBICFWUQLRXINOCIJLWJFQUNWXLFBSZXFBT"
				  "XAANTQIFBFSFQUFCZFSBSCSBIMWHWLNKAXBISWGSTOXLXTSWLUQLXJBUUWLWISTBKOWLSWGSTOXLXTSWL"
				  "BSJBUUWLFULQRTXWFXLTBKOWLBISOXSSOWTBKOWLXAKOXZWSBFIQSFBRKANSOWXAKOXZWSFOBUSWJBSBF"
				  "TQRKAWSWANECRZAWJ";
	char result[sizeof(text)];
	char key[27];

	struct cipher_data data = {
			.ct = text,
			.key = key,
			.use_autocrack = true,
			.scorer = &scorer,
			.result = result,
	};

	substitution_with_data(&data);

	TEST_ASSERT_EQUAL_INT(true, data.success);
	TEST_ASSERT_EQUAL_STRING("LIUZJSXVNDPRGYHQOMTCFKEAWB", data.key);
	TEST_ASSERT_EQUAL_STRING("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASIC"
							 "ALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTER"
							 "ITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITIS"
							 "COMPLETELYJUMBLED", data.result);

	// Test solve with key

	char result2[sizeof(text)];

	struct cipher_data data2 = {
			.ct = text,
			.key = "LIUZJSXVNDPRGYHQOMTCFKEAWB",
			.use_autocrack = false,
			.scorer = &scorer,
			.result = result2,
	};

	substitution_with_data(&data2);

	TEST_ASSERT_EQUAL_INT(true, data2.success);
	TEST_ASSERT_EQUAL_STRING("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASIC"
							 "ALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTER"
							 "ITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITIS"
							 "COMPLETELYJUMBLED", data2.result);
}